

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O3

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnBrExpr(BinaryReaderInterp *this,Index depth)

{
  Result RVar1;
  Enum EVar2;
  Index catch_drop_count;
  Index keep_count;
  Index drop_count;
  Location loc_1;
  Location loc;
  Index local_c4;
  Index local_c0;
  Index local_bc;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  RVar1 = GetBrDropKeepCount(this,depth,&local_bc,&local_c0);
  EVar2 = Error;
  if (RVar1.enum_ != Error) {
    RVar1 = TypeChecker::GetCatchCount(&(this->validator_).typechecker_,depth,&local_c4);
    if (RVar1.enum_ != Error) {
      local_98.field_1.field_0.last_column = 0;
      local_98.filename._M_len = (this->filename_)._M_len;
      local_98.filename._M_str = (this->filename_)._M_str;
      local_b8.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
      local_b8.field_1.field_0.last_column = 0;
      local_b8.filename._M_len = (this->filename_)._M_len;
      local_b8.filename._M_str = (this->filename_)._M_str;
      local_98.field_1.field_1.offset = local_b8.field_1.field_1.offset;
      Var::Var(&local_78,depth,&local_b8);
      RVar1 = SharedValidator::OnBr(&this->validator_,&local_98,&local_78);
      Var::~Var(&local_78);
      if (RVar1.enum_ != Error) {
        EmitBr(this,depth,local_bc,local_c0,local_c4);
        EVar2 = Ok;
      }
    }
  }
  return (Result)EVar2;
}

Assistant:

Result BinaryReaderInterp::OnBrExpr(Index depth) {
  Index drop_count, keep_count, catch_drop_count;
  CHECK_RESULT(GetBrDropKeepCount(depth, &drop_count, &keep_count));
  CHECK_RESULT(validator_.GetCatchCount(depth, &catch_drop_count));
  CHECK_RESULT(validator_.OnBr(GetLocation(), Var(depth, GetLocation())));
  EmitBr(depth, drop_count, keep_count, catch_drop_count);
  return Result::Ok;
}